

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int nonce_function_bip340
              (uchar *nonce32,uchar *msg,size_t msglen,uchar *key32,uchar *xonly_pk32,uchar *algo,
              size_t algolen,void *data)

{
  uint *puVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  uchar *puVar12;
  uchar *puVar13;
  unsigned_long _zzq_result;
  secp256k1_sha256 sha;
  unsigned_long _zzq_args [6];
  uint local_f8 [8];
  secp256k1_sha256 local_d8;
  
  if (algo == (uchar *)0x0) {
    return 0;
  }
  if (data == (void *)0x0) {
    lVar10 = 0;
    puVar12 = nonce_function_bip340::ZERO_MASK;
    do {
      puVar1 = (uint *)(key32 + lVar10);
      uVar4 = puVar1[1];
      uVar5 = puVar1[2];
      uVar6 = puVar1[3];
      uVar7 = *(uint *)(nonce_function_bip340::ZERO_MASK + lVar10 + 4);
      uVar8 = *(uint *)(nonce_function_bip340::ZERO_MASK + lVar10 + 8);
      uVar9 = *(uint *)(nonce_function_bip340::ZERO_MASK + lVar10 + 0xc);
      *(uint *)((long)local_f8 + lVar10) =
           *puVar1 ^ *(uint *)(nonce_function_bip340::ZERO_MASK + lVar10);
      *(uint *)((long)local_f8 + lVar10 + 4) = uVar4 ^ uVar7;
      *(uint *)((long)local_f8 + lVar10 + 8) = uVar5 ^ uVar8;
      *(uint *)((long)local_f8 + lVar10 + 0xc) = uVar6 ^ uVar9;
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x20);
  }
  else {
    local_d8.s[0] = 0x24dd3219;
    local_d8.s[1] = 0x4eba7e70;
    local_d8.s[2] = 0xca0fabb9;
    local_d8.s[3] = 0xfa3166d;
    local_d8.s[4] = 0x3afbe4b1;
    local_d8.s[5] = 0x4c44df97;
    local_d8.s[6] = 0x4aac2739;
    local_d8.s[7] = 0x249e850a;
    local_d8.bytes = 0x40;
    puVar12 = key32;
    secp256k1_sha256_write(&local_d8,(uchar *)data,0x20);
    secp256k1_sha256_finalize(&local_d8,(uchar *)local_f8);
    lVar10 = 0;
    do {
      puVar1 = (uint *)(key32 + lVar10);
      uVar4 = puVar1[1];
      uVar5 = puVar1[2];
      uVar6 = puVar1[3];
      *(uint *)((long)local_f8 + lVar10) = *puVar1 ^ *(uint *)((long)local_f8 + lVar10);
      *(uint *)((long)local_f8 + lVar10 + 4) = uVar4 ^ *(uint *)((long)local_f8 + lVar10 + 4);
      *(uint *)((long)local_f8 + lVar10 + 8) = uVar5 ^ *(uint *)((long)local_f8 + lVar10 + 8);
      *(uint *)((long)local_f8 + lVar10 + 0xc) = uVar6 ^ *(uint *)((long)local_f8 + lVar10 + 0xc);
      lVar10 = lVar10 + 0x10;
    } while (lVar10 != 0x20);
  }
  if (algolen == 0xd) {
    lVar10 = 0;
    do {
      puVar13 = (uchar *)((ulong)puVar12 & 0xffffffff);
      bVar2 = algo[lVar10];
      bVar3 = "BIP0340/nonce"[lVar10];
      puVar12 = (uchar *)(ulong)((uint)bVar2 - (uint)bVar3);
      if (bVar2 == bVar3) {
        puVar12 = puVar13;
      }
      iVar11 = (int)puVar12;
      if (bVar2 != bVar3) goto LAB_0012426b;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0xd);
    iVar11 = 0;
LAB_0012426b:
    if (iVar11 == 0) {
      local_d8.s[0] = 0x46615b35;
      local_d8.s[1] = 0xf4bfbff7;
      local_d8.s[2] = 0x9f8dc671;
      local_d8.s[3] = 0x83627ab3;
      local_d8.s[4] = 0x60217180;
      local_d8.s[5] = 0x57358661;
      local_d8.s[6] = 0x21a29e54;
      local_d8.s[7] = 0x68b07b4c;
      local_d8.bytes = 0x40;
      goto LAB_00124280;
    }
  }
  secp256k1_sha256_initialize_tagged(&local_d8,algo,algolen);
LAB_00124280:
  secp256k1_sha256_write(&local_d8,(uchar *)local_f8,0x20);
  secp256k1_sha256_write(&local_d8,xonly_pk32,0x20);
  secp256k1_sha256_write(&local_d8,msg,msglen);
  secp256k1_sha256_finalize(&local_d8,nonce32);
  return 1;
}

Assistant:

static int nonce_function_bip340(unsigned char *nonce32, const unsigned char *msg, size_t msglen, const unsigned char *key32, const unsigned char *xonly_pk32, const unsigned char *algo, size_t algolen, void *data) {
    secp256k1_sha256 sha;
    unsigned char masked_key[32];
    int i;

    if (algo == NULL) {
        return 0;
    }

    if (data != NULL) {
        secp256k1_nonce_function_bip340_sha256_tagged_aux(&sha);
        secp256k1_sha256_write(&sha, data, 32);
        secp256k1_sha256_finalize(&sha, masked_key);
        for (i = 0; i < 32; i++) {
            masked_key[i] ^= key32[i];
        }
    } else {
        /* Precomputed TaggedHash("BIP0340/aux", 0x0000...00); */
        static const unsigned char ZERO_MASK[32] = {
              84, 241, 105, 207, 201, 226, 229, 114,
             116, 128,  68,  31, 144, 186,  37, 196,
             136, 244,  97, 199,  11,  94, 165, 220,
             170, 247, 175, 105, 39,  10, 165,  20
        };
        for (i = 0; i < 32; i++) {
            masked_key[i] = key32[i] ^ ZERO_MASK[i];
        }
    }

    /* Tag the hash with algo which is important to avoid nonce reuse across
     * algorithms. If this nonce function is used in BIP-340 signing as defined
     * in the spec, an optimized tagging implementation is used. */
    if (algolen == sizeof(bip340_algo)
            && secp256k1_memcmp_var(algo, bip340_algo, algolen) == 0) {
        secp256k1_nonce_function_bip340_sha256_tagged(&sha);
    } else {
        secp256k1_sha256_initialize_tagged(&sha, algo, algolen);
    }

    /* Hash masked-key||pk||msg using the tagged hash as per the spec */
    secp256k1_sha256_write(&sha, masked_key, 32);
    secp256k1_sha256_write(&sha, xonly_pk32, 32);
    secp256k1_sha256_write(&sha, msg, msglen);
    secp256k1_sha256_finalize(&sha, nonce32);
    secp256k1_sha256_clear(&sha);
    secp256k1_memclear(masked_key, sizeof(masked_key));

    return 1;
}